

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O0

void mpp_sthd_setup(MppSThd thd,MppSThdFunc func,void *ctx)

{
  undefined8 uVar1;
  char *pcVar2;
  MppSThdStatus status;
  MppSThdImpl *impl;
  void *ctx_local;
  MppSThdFunc func_local;
  MppSThd thd_local;
  
  check_sthd("mpp_sthd_setup",(MppSThdImpl *)thd);
  pthread_mutex_lock((pthread_mutex_t *)((long)thd + 0x20));
  if (*(MppSThdStatus *)((long)thd + 0x10) < MPP_STHD_RUNNING) {
    *(MppSThdFunc *)((long)thd + 8) = func;
    *(void **)((long)thd + 0x80) = ctx;
    *(uint *)((long)thd + 0x10) = (uint)(func != (MppSThdFunc)0x0);
  }
  else {
    uVar1 = *thd;
    pcVar2 = state2str(*(MppSThdStatus *)((long)thd + 0x10));
    _mpp_log_l(2,"mpp_thread","%s can NOT setup on %s\n",(char *)0x0,uVar1,pcVar2);
  }
  pthread_mutex_unlock((pthread_mutex_t *)((long)thd + 0x20));
  check_sthd("mpp_sthd_setup",(MppSThdImpl *)thd);
  return;
}

Assistant:

void mpp_sthd_setup(MppSThd thd, MppSThdFunc func, void *ctx)
{
    MppSThdImpl *impl = (MppSThdImpl *)thd;
    MppSThdStatus status;

    CHECK_STHD(impl);

    pthread_mutex_lock(&impl->lock);
    status = impl->status;
    switch (status) {
    case MPP_STHD_UNINITED :
    case MPP_STHD_READY : {
        impl->func = func;
        impl->ctx.ctx = ctx;
        impl->status = func ? MPP_STHD_READY : MPP_STHD_UNINITED;
    } break;
    default : {
        mpp_err("%s can NOT setup on %s\n", impl->name, state2str(status));
    } break;
    }
    pthread_mutex_unlock(&impl->lock);

    CHECK_STHD(impl);
}